

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_pax.c
# Opt level: O2

void compare_acls(archive_entry *ae,acl_t *acls,int n,int mode)

{
  char cVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  wchar_t wVar8;
  int iVar9;
  mode_t mVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  wchar_t line;
  int *piVar15;
  uint uVar16;
  int permset;
  uint local_8c;
  int *local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  int local_64;
  int local_60;
  int qual;
  int tag;
  int type;
  archive_entry *local_50;
  ulong local_48;
  char *local_40;
  char *name;
  
  local_50 = ae;
  local_88 = (int *)malloc((ulong)(uint)n << 2);
  uVar13 = 0;
  uVar11 = 0;
  if (0 < n) {
    uVar11 = (ulong)(uint)n;
  }
  for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
    local_88[uVar13] = (int)uVar13;
  }
  local_68 = mode & 7;
  local_6c = (uint)mode >> 3 & 7;
  local_70 = mode & 0x38;
  local_74 = (uint)mode >> 6 & 7;
  local_78 = mode & 0x1c0;
  local_7c = mode;
  do {
    wVar8 = archive_entry_acl_next(local_50,L'Ā',&type,&permset,&tag,&qual,&name);
    iVar3 = type;
    uVar16 = permset;
    if (wVar8 != L'\0') {
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                          ,L'Å',1,"ARCHIVE_EOF",(long)wVar8,"r",(void *)0x0);
      mVar10 = archive_entry_mode(local_50);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                       ,L'Æ',(uint)(((mVar10 ^ local_7c) & 0x1ff) == 0),
                       "(mode_t)(mode & 0777) == (archive_entry_mode(ae) & 0777)",(void *)0x0);
      piVar15 = local_88;
      iVar3 = *local_88;
      failure("Could not find match for ACL (type=%d,permset=%d,tag=%d,qual=%d,name=``%s\'\')",
              (ulong)(uint)acls[iVar3].type,(ulong)(uint)acls[iVar3].permset,
              (ulong)(uint)acls[iVar3].tag,(ulong)(uint)acls[iVar3].qual,acls[iVar3].name);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                       ,L'Ë',(uint)(n == 0),"n == 0",(void *)0x0);
      free(piVar15);
      return;
    }
    uVar11 = (ulong)(uint)tag;
    lVar14 = 0;
    local_8c = tag - 0x2712;
    bVar4 = false;
    local_40 = name;
    piVar15 = local_88;
    local_64 = qual;
    while( true ) {
      iVar9 = (int)uVar11;
      if ((n <= lVar14) || (bVar4)) break;
      iVar2 = piVar15[lVar14];
      bVar4 = false;
      bVar5 = false;
      iVar7 = n;
      if (((acls[iVar2].type == iVar3) && (acls[iVar2].permset == uVar16)) &&
         (acls[iVar2].tag == iVar9)) {
        if ((local_8c < 5) && ((0x15U >> (local_8c & 0x1f) & 1) != 0)) {
LAB_0011efac:
          piVar15[lVar14] = piVar15[(long)n + -1];
          iVar7 = n + -1;
          bVar4 = true;
        }
        else {
          bVar4 = bVar5;
          if (acls[iVar2].qual == local_64) {
            pcVar12 = acls[iVar2].name;
            if (local_40 == (char *)0x0) {
              if (pcVar12 == (char *)0x0) goto LAB_0011efac;
              cVar1 = *pcVar12;
            }
            else {
              if (pcVar12 != (char *)0x0) {
                local_60 = n;
                local_48 = uVar11;
                iVar9 = strcmp(local_40,pcVar12);
                uVar11 = local_48;
                piVar15 = local_88;
                iVar7 = local_60;
                if (iVar9 == 0) goto LAB_0011efac;
                goto LAB_0011efbc;
              }
              cVar1 = *local_40;
            }
            if (cVar1 == '\0') goto LAB_0011efac;
          }
        }
      }
LAB_0011efbc:
      n = iVar7;
      lVar14 = lVar14 + 1;
    }
    if (iVar9 == 0x2716) {
      if (!bVar4) {
        puts("No match for other perm");
        uVar16 = permset;
      }
      uVar6 = local_68;
      failure("OTHER permset (%02o) != other mode (%02o)",(ulong)uVar16,(ulong)local_68);
      wVar8 = (wchar_t)(permset == uVar6);
      line = L'½';
      pcVar12 = "(permset << 0) == (mode & 0007)";
    }
    else if (iVar9 == 0x2714) {
      if (!bVar4) {
        puts("No match for group_obj perm");
        uVar16 = permset;
      }
      failure("GROUP_OBJ permset %02o != group mode %02o",(ulong)uVar16,(ulong)local_6c);
      wVar8 = (wchar_t)(permset << 3 == local_70);
      line = L'¸';
      pcVar12 = "(permset << 3) == (mode & 0070)";
    }
    else if (iVar9 == 0x2712) {
      if (!bVar4) {
        puts("No match for user_obj perm");
        uVar16 = permset;
      }
      failure("USER_OBJ permset (%02o) != user mode (%02o)",(ulong)uVar16,(ulong)local_74);
      wVar8 = (wchar_t)(permset << 6 == local_78);
      line = L'³';
      pcVar12 = "(permset << 6) == (mode & 0700)";
    }
    else {
      failure("Could not find match for ACL (type=%d,permset=%d,tag=%d,qual=%d,name=``%s\'\')",
              (ulong)(uint)iVar3,(ulong)uVar16);
      wVar8 = (wchar_t)bVar4;
      line = L'Â';
      pcVar12 = "matched == 1";
    }
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_acl_posix1e.c"
                     ,line,wVar8,pcVar12,(void *)0x0);
  } while( true );
}

Assistant:

static void
compare_acls(struct archive_entry *ae, struct acl_t *acls, int n, int mode)
{
	int *marker = malloc(sizeof(marker[0]) * n);
	int i;
	int r;
	int type, permset, tag, qual;
	int matched;
	const char *name;

	for (i = 0; i < n; i++)
		marker[i] = i;

	while (0 == (r = archive_entry_acl_next(ae,
			 ARCHIVE_ENTRY_ACL_TYPE_ACCESS,
			 &type, &permset, &tag, &qual, &name))) {
		for (i = 0, matched = 0; i < n && !matched; i++) {
			if (acl_match(&acls[marker[i]], type, permset,
				tag, qual, name)) {
				/* We found a match; remove it. */
				marker[i] = marker[n - 1];
				n--;
				matched = 1;
			}
		}
		if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ) {
			if (!matched) printf("No match for user_obj perm\n");
			failure("USER_OBJ permset (%02o) != user mode (%02o)",
			    permset, 07 & (mode >> 6));
			assert((permset << 6) == (mode & 0700));
		} else if (tag == ARCHIVE_ENTRY_ACL_GROUP_OBJ) {
			if (!matched) printf("No match for group_obj perm\n");
			failure("GROUP_OBJ permset %02o != group mode %02o",
			    permset, 07 & (mode >> 3));
			assert((permset << 3) == (mode & 0070));
		} else if (tag == ARCHIVE_ENTRY_ACL_OTHER) {
			if (!matched) printf("No match for other perm\n");
			failure("OTHER permset (%02o) != other mode (%02o)",
			    permset, mode & 07);
			assert((permset << 0) == (mode & 0007));
		} else {
			failure("Could not find match for ACL "
			    "(type=%d,permset=%d,tag=%d,qual=%d,name=``%s'')",
			    type, permset, tag, qual, name);
			assert(matched == 1);
		}
	}
	assertEqualInt(ARCHIVE_EOF, r);
	assert((mode_t)(mode & 0777) == (archive_entry_mode(ae) & 0777));
	failure("Could not find match for ACL "
	    "(type=%d,permset=%d,tag=%d,qual=%d,name=``%s'')",
	    acls[marker[0]].type, acls[marker[0]].permset,
	    acls[marker[0]].tag, acls[marker[0]].qual, acls[marker[0]].name);
	assert(n == 0); /* Number of ACLs not matched should == 0 */
	free(marker);
}